

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  buffer<char> *this;
  type tVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ulong __maxlen;
  undefined1 *puVar5;
  undefined8 in_R9;
  int local_80;
  undefined1 local_79;
  type size;
  int result;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  size_t capacity;
  char *begin;
  size_t offset;
  char *format_ptr;
  buffer<char> *pbStack_38;
  char format [7];
  buffer<char> *buf_local;
  int precision_local;
  longdouble value_local;
  uint uStack_c;
  float_specs specs_local;
  
  pbStack_38 = buf;
  sVar2 = buffer<char>::capacity(buf);
  sVar3 = buffer<char>::size(pbStack_38);
  if (sVar2 <= sVar3) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/fmt-src/include/fmt/format.h"
                ,0x62e,"empty buffer");
  }
  uStack_c = specs._4_4_;
  if (specs._4_1_ == '\x03') {
    offset = (long)&format_ptr + 2;
    format_ptr._1_1_ = 0x25;
    if ((uStack_c >> 0x13 & 1) != 0) {
      offset = (long)&format_ptr + 3;
      format_ptr._2_1_ = 0x23;
    }
    if (-1 < precision) {
      puVar5 = (undefined1 *)(offset + 1);
      *(undefined1 *)offset = 0x2e;
      offset = offset + 2;
      *puVar5 = 0x2a;
    }
    *(undefined1 *)offset = 0x4c;
    local_79 = 0x41;
    if (((ulong)specs & 0x1000000000000) == 0) {
      local_79 = 0x61;
    }
    *(undefined1 *)(offset + 1) = local_79;
    *(undefined1 *)(offset + 2) = 0;
    sVar2 = buffer<char>::size(pbStack_38);
    while( true ) {
      while( true ) {
        pcVar4 = buffer<char>::data(pbStack_38);
        sVar3 = buffer<char>::capacity(pbStack_38);
        __maxlen = sVar3 - sVar2;
        abort_fuzzing_if(100000 < precision);
        if (precision < 0) {
          local_80 = snprintf(pcVar4 + sVar2,__maxlen,(char *)((long)&format_ptr + 1),snprintf);
        }
        else {
          local_80 = snprintf(pcVar4 + sVar2,__maxlen,(char *)((long)&format_ptr + 1),
                              (ulong)(uint)precision,snprintf,in_R9,value);
        }
        this = pbStack_38;
        if (-1 < local_80) break;
        sVar3 = buffer<char>::capacity(pbStack_38);
        buffer<char>::try_reserve(this,sVar3 + 1);
      }
      tVar1 = to_unsigned<int>(local_80);
      if (tVar1 < __maxlen) break;
      buffer<char>::try_reserve(pbStack_38,tVar1 + sVar2 + 1);
    }
    buffer<char>::try_resize(pbStack_38,tVar1 + sVar2);
    return 0;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/fmt-src/include/fmt/format.h"
              ,0x62f,"");
}

Assistant:

auto snprintf_float(T value, int precision, float_specs specs,
                    buffer<char>& buf) -> int {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  FMT_ASSERT(specs.format == float_format::hex, "");
  static_assert(!std::is_same<T, float>::value, "");

  // Build the format string.
  char format[7];  // The longest format is "%#.*Le".
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.upper ? 'A' : 'a';
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
    abort_fuzzing_if(precision > 100000);
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size < capacity) {
      buf.try_resize(size + offset);
      return 0;
    }
    buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
  }
}